

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O3

double __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
::_mat(BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label_i,
      basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label_j)

{
  ulong uVar1;
  ulong uVar2;
  StorageIndex *pSVar3;
  StorageIndex *pSVar4;
  StorageIndex *pSVar5;
  const_iterator cVar6;
  ulong uVar7;
  runtime_error *this_00;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  __hashtable *__h;
  Scalar SVar14;
  
  cVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->_label_to_idx)._M_h,label_i);
  if (cVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur != (__node_type *)0x0) {
    uVar1 = *(ulong *)((long)cVar6.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                             ._M_cur + 0x28);
    cVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->_label_to_idx)._M_h,label_j);
    if (cVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur != (__node_type *)0x0) {
      uVar2 = *(ulong *)((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                               ._M_cur + 0x28);
      if (uVar1 == uVar2) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"No self-loop (mat(i,i)) allowed");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar7 = uVar2;
      if (uVar2 < uVar1) {
        uVar7 = uVar1;
        uVar1 = uVar2;
      }
      if ((((-1 < (long)uVar1) && (-1 < (long)uVar7)) &&
          ((long)uVar1 < (this->_quadmat).m_outerSize)) &&
         ((long)uVar7 < (this->_quadmat).m_innerSize)) {
        pSVar3 = (this->_quadmat).m_outerIndex;
        pSVar4 = (this->_quadmat).m_innerNonZeros;
        if (pSVar4 == (StorageIndex *)0x0) {
          iVar12 = pSVar3[uVar1];
          iVar8 = pSVar3[uVar1 + 1];
        }
        else {
          iVar12 = pSVar3[uVar1];
          iVar8 = pSVar4[uVar1] + iVar12;
        }
        SVar14 = 0.0;
        if (iVar12 < iVar8) {
          lVar10 = (long)iVar8;
          iVar8 = (int)uVar7;
          pSVar5 = (this->_quadmat).m_data.m_indices;
          lVar13 = lVar10 + -1;
          if (iVar8 != pSVar5[lVar10 + -1]) {
            lVar9 = (long)iVar12;
            while (lVar11 = lVar13, lVar9 < lVar11) {
              lVar13 = lVar11 + lVar9 >> 1;
              if (pSVar5[lVar13] < iVar8) {
                lVar9 = lVar13 + 1;
                lVar13 = lVar11;
              }
            }
            if (lVar10 <= lVar9) {
              return 0.0;
            }
            lVar13 = lVar9;
            if (iVar8 != pSVar5[lVar9]) {
              return 0.0;
            }
          }
          SVar14 = (this->_quadmat).m_data.m_values[lVar13];
        }
        return SVar14;
      }
      __assert_fail("row>=0 && row<rows() && col>=0 && col<cols()",
                    "/usr/include/eigen3/Eigen/src/SparseCore/SparseMatrix.h",0xc0,
                    "Scalar Eigen::SparseMatrix<double, 1>::coeff(Index, Index) const [_Scalar = double, _Options = 1, _StorageIndex = int]"
                   );
    }
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

inline FloatType _mat( IndexType label_i, IndexType label_j ) const {
      size_t i = _label_to_idx.at( label_i );
      size_t j = _label_to_idx.at( label_j );

      if ( i != j )
        return _quadmat_get( std::min( i, j ), std::max( i, j ) );
      else
        throw std::runtime_error( "No self-loop (mat(i,i)) allowed" );
    }